

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void nivalis::anon_unknown_1::buf_add_polyline
               (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                *draw_buf,View *render_view,
               vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *points,
               color *c,size_t rel_func,float thickness,bool closed,bool line,bool filled)

{
  pointer paVar1;
  size_type sVar2;
  reference pvVar3;
  double *pdVar4;
  reference pvVar5;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *in_RDX;
  undefined8 in_R8;
  byte in_R9B;
  undefined4 in_XMM0_Da;
  double dVar6;
  double __y;
  double dVar7;
  double dVar8;
  byte in_stack_00000008;
  byte in_stack_00000010;
  double angle_between;
  double theta_b;
  double theta_a;
  double by;
  double bx;
  double ay;
  double ax;
  size_t j;
  size_t i;
  DrawBufferObject obj;
  DrawBufferObject obj_fill;
  value_type *in_stack_fffffffffffffd48;
  DrawBufferObject *in_stack_fffffffffffffd50;
  value_type *in_stack_fffffffffffffd58;
  DrawBufferObject *in_stack_fffffffffffffd60;
  value_type_conflict2 __new_size;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *this;
  DrawBufferObject *in_stack_fffffffffffffd78;
  value_type_conflict2 vVar9;
  DrawBufferObject *in_stack_fffffffffffffd80;
  value_type *this_00;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  *in_stack_fffffffffffffde8;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  *in_stack_fffffffffffffdf0;
  ulong local_1d8;
  value_type local_1a0 [2];
  undefined4 local_98;
  undefined8 local_60;
  undefined4 local_38;
  byte local_2f;
  byte local_2e;
  byte local_2d;
  undefined4 local_2c;
  undefined8 local_28;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *local_18;
  
  local_2d = in_R9B & 1;
  local_2e = in_stack_00000008 & 1;
  local_2f = in_stack_00000010 & 1;
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_18 = in_RDX;
  DrawBufferObject::DrawBufferObject(in_stack_fffffffffffffd60);
  local_60 = local_28;
  local_98 = local_2c;
  if ((local_2f & 1) != 0) {
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_38 = 2;
    get_ineq_color((color *)in_stack_fffffffffffffd58);
    color::color::operator=((color *)in_stack_fffffffffffffd58,(color *)in_stack_fffffffffffffd50);
    std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::push_back
              ((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
               in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  }
  if ((local_2e & 1) != 0) {
    DrawBufferObject::DrawBufferObject(in_stack_fffffffffffffd60);
    DrawBufferObject::operator=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    color::color::operator=((color *)in_stack_fffffffffffffd58,(color *)in_stack_fffffffffffffd50);
    local_1a0[0].type = local_2d & POLYGON;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size(local_18);
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::reserve
              (&in_stack_fffffffffffffd80->points,(size_type)in_stack_fffffffffffffd78);
    for (local_1d8 = 0;
        sVar2 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                size(local_18), local_1d8 < sVar2; local_1d8 = local_1d8 + 1) {
      sVar2 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::size
                        (&local_1a0[0].points);
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (local_18,local_1d8);
      std::array<double,_2UL>::operator[]
                ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                 (size_type)in_stack_fffffffffffffd48);
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                (local_18,local_1d8);
      std::array<double,_2UL>::operator[]
                ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                 (size_type)in_stack_fffffffffffffd48);
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
                (&in_stack_fffffffffffffd50->points,(value_type *)in_stack_fffffffffffffd48);
      if (1 < sVar2) {
        this_00 = local_1a0;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this_00->points,sVar2);
        this = (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)0x0;
        pvVar3 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                            (size_type)in_stack_fffffffffffffd48);
        in_stack_fffffffffffffd60 = (DrawBufferObject *)*pvVar3;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this_00->points,sVar2 - 1);
        pvVar3 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                            (size_type)in_stack_fffffffffffffd48);
        dVar6 = (double)in_stack_fffffffffffffd60 - *pvVar3;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this_00->points,sVar2);
        pvVar3 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                            (size_type)in_stack_fffffffffffffd48);
        __new_size = *pvVar3;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this_00->points,sVar2 - 1);
        pvVar3 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                            (size_type)in_stack_fffffffffffffd48);
        __y = __new_size - *pvVar3;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this_00->points,sVar2 - 1);
        pvVar3 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                            (size_type)in_stack_fffffffffffffd48);
        vVar9 = *pvVar3;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this_00->points,sVar2 - 2);
        pvVar3 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                            (size_type)in_stack_fffffffffffffd48);
        dVar8 = *pvVar3;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this_00->points,sVar2 - 1);
        pvVar3 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                            (size_type)in_stack_fffffffffffffd48);
        dVar7 = *pvVar3;
        std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator[]
                  (&this_00->points,sVar2 - 2);
        pvVar3 = std::array<double,_2UL>::operator[]
                           ((array<double,_2UL> *)in_stack_fffffffffffffd50,
                            (size_type)in_stack_fffffffffffffd48);
        dVar7 = dVar7 - *pvVar3;
        dVar6 = atan2(__y,dVar6);
        dVar6 = fmod(dVar6 + 6.283185307179586,6.283185307179586);
        dVar8 = atan2(dVar7,vVar9 - dVar8);
        local_220 = fmod(dVar8 + 6.283185307179586,6.283185307179586);
        local_230 = ABS(dVar6 - local_220);
        local_238 = ABS((dVar6 + 6.283185307179586) - local_220);
        pdVar4 = std::min<double>(&local_230,&local_238);
        local_228 = *pdVar4;
        if (ABS(local_228 - 3.141592653589793) < 0.1) {
          std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
          push_back((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *
                    )in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
          in_stack_fffffffffffffd58 = local_1a0;
          in_stack_fffffffffffffd48 =
               (value_type *)
               std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
               operator[](&in_stack_fffffffffffffd58->points,sVar2 - 1);
          pvVar5 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                   operator[](&in_stack_fffffffffffffd58->points,0);
          paVar1 = (in_stack_fffffffffffffd48->points).
                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar5->_M_elems[0] =
               (double)(in_stack_fffffffffffffd48->points).
                       super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          pvVar5->_M_elems[1] = (double)paVar1;
          in_stack_fffffffffffffd50 =
               (DrawBufferObject *)
               std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
               operator[](&in_stack_fffffffffffffd58->points,sVar2);
          pvVar5 = std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::
                   operator[](&in_stack_fffffffffffffd58->points,1);
          paVar1 = (in_stack_fffffffffffffd50->points).
                   super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pvVar5->_M_elems[0] =
               (double)(in_stack_fffffffffffffd50->points).
                       super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          pvVar5->_M_elems[1] = (double)paVar1;
          std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                    (this,(size_type)__new_size);
        }
      }
    }
    std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::push_back
              ((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    DrawBufferObject::~DrawBufferObject(in_stack_fffffffffffffd50);
  }
  DrawBufferObject::~DrawBufferObject(in_stack_fffffffffffffd50);
  return;
}

Assistant:

void buf_add_polyline(
        std::vector<DrawBufferObject>& draw_buf,
        const Plotter::View& render_view,
        const std::vector<std::array<double, 2> >& points,
        const color::color& c, size_t rel_func, float thickness = 1.,
        bool closed = false, bool line = true, bool filled = false) {
    DrawBufferObject obj_fill;
    obj_fill.rel_func = rel_func;
    obj_fill.thickness = thickness;
    if (filled) {
        obj_fill.points = points;
        obj_fill.type = DrawBufferObject::FILLED_POLYGON;
        obj_fill.c = get_ineq_color(c);
        draw_buf.push_back(std::move(obj_fill));
    }
    if (line) {
        // Detect colinearities
        DrawBufferObject obj;
        obj = obj_fill;
        obj.c = c;
        obj.type = closed ? DrawBufferObject::POLYGON :
            DrawBufferObject::POLYLINE;
        obj.points.reserve(points.size());
        // draw_buf.push_back(std::move(obj_tmp));
        for (size_t i = 0; i < points.size(); ++i) {
            // if (std::isnan(points[i][0])) break;
            size_t j = obj.points.size();
            obj.points.push_back({points[i][0], points[i][1]});
            if (j >= 2) {
                double ax = (obj.points[j][0] - obj.points[j-1][0]);
                double ay = (obj.points[j][1] - obj.points[j-1][1]);
                double bx = (obj.points[j-1][0] - obj.points[j-2][0]);
                double by = (obj.points[j-1][1] - obj.points[j-2][1]);
                double theta_a = std::fmod(std::atan2(ay, ax) + 2*M_PI, 2*M_PI);
                double theta_b = std::fmod(std::atan2(by, bx) + 2*M_PI, 2*M_PI);
                double angle_between = std::min(std::fabs(theta_a - theta_b),
                        std::fabs(theta_a + 2*M_PI - theta_b));
                if (std::fabs(angle_between - M_PI) < 1e-1) {
                    // Near-colinear, currently ImGui's polyline drawing may will break
                    // in this case. We split the obj.points here.
                    draw_buf.push_back(obj);
                    obj.points[0] = obj.points[j-1]; obj.points[1] = obj.points[j];
                    obj.points.resize(2);
                }
            }
        }
        draw_buf.push_back(obj);
    }
}